

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

void mpiwrapper_store_sentinels_
               (char **mpi_argv_null_,char ***mpi_argvs_null_,MPIABI_Fint *mpi_bottom_,
               MPIABI_Fint *mpi_errcodes_ignore_,MPIABI_Fint *mpi_in_place_,
               MPIABI_Fint *mpi_status_ignore_,MPIABI_Fint *mpi_statuses_ignore_,
               MPIABI_Fint *mpi_unweighted_,MPIABI_Fint *mpi_weights_empty_)

{
  MPIABI_Fint *mpi_status_ignore__local;
  MPIABI_Fint *mpi_in_place__local;
  MPIABI_Fint *mpi_errcodes_ignore__local;
  MPIABI_Fint *mpi_bottom__local;
  char ***mpi_argvs_null__local;
  char **mpi_argv_null__local;
  
  mpiabi_argv_null_ = mpi_argv_null_;
  mpiabi_argvs_null_ = mpi_argvs_null_;
  mpiabi_bottom_ = mpi_bottom_;
  mpiabi_errcodes_ignore_ = mpi_errcodes_ignore_;
  mpiabi_in_place_ = mpi_in_place_;
  mpiabi_status_ignore_ = mpi_status_ignore_;
  mpiabi_statuses_ignore_ = mpi_statuses_ignore_;
  mpiabi_unweighted_ = mpi_unweighted_;
  mpiabi_weights_empty_ = mpi_weights_empty_;
  return;
}

Assistant:

void mpiwrapper_store_sentinels_(
    char **mpi_argv_null_, char ***mpi_argvs_null_, MPIABI_Fint *mpi_bottom_,
    MPIABI_Fint *mpi_errcodes_ignore_, MPIABI_Fint *mpi_in_place_,
    MPIABI_Fint *mpi_status_ignore_, MPIABI_Fint *mpi_statuses_ignore_,
    MPIABI_Fint *mpi_unweighted_, MPIABI_Fint *mpi_weights_empty_) {
  mpiabi_argv_null_ = mpi_argv_null_;
  mpiabi_argvs_null_ = mpi_argvs_null_;
  mpiabi_bottom_ = mpi_bottom_;
  mpiabi_errcodes_ignore_ = mpi_errcodes_ignore_;
  mpiabi_in_place_ = mpi_in_place_;
  mpiabi_status_ignore_ = mpi_status_ignore_;
  mpiabi_statuses_ignore_ = mpi_statuses_ignore_;
  mpiabi_unweighted_ = mpi_unweighted_;
  mpiabi_weights_empty_ = mpi_weights_empty_;
}